

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgtdmll(fitsfile *fptr,int colnum,int maxdim,int *naxis,LONGLONG *naxes,int *status)

{
  char local_d8 [8];
  char tdimstr [71];
  char local_88 [8];
  char keyname [75];
  int tstatus;
  int *status_local;
  LONGLONG *naxes_local;
  int *naxis_local;
  int maxdim_local;
  int colnum_local;
  fitsfile *fptr_local;
  
  keyname[0x44] = '\0';
  keyname[0x45] = '\0';
  keyname[0x46] = '\0';
  keyname[0x47] = '\0';
  if (*status < 1) {
    unique0x10000086 = status;
    ffkeyn("TDIM",colnum,local_88,status);
    ffgkys(fptr,local_88,local_d8,(char *)0x0,(int *)(keyname + 0x44));
    ffdtdmll(fptr,local_d8,colnum,maxdim,naxis,naxes,stack0xffffffffffffffc8);
    fptr_local._4_4_ = *stack0xffffffffffffffc8;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgtdmll(fitsfile *fptr,  /* I - FITS file pointer                      */
           int colnum,      /* I - number of the column to read             */
           int maxdim,      /* I - maximum no. of dimensions to read;       */
           int *naxis,      /* O - number of axes in the data array         */
           LONGLONG naxes[], /* O - length of each data axis                 */
           int *status)     /* IO - error status                            */
/*
  read and parse the TDIMnnn keyword to get the dimensionality of a column
*/
{
    int tstatus = 0;
    char keyname[FLEN_KEYWORD], tdimstr[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    ffkeyn("TDIM", colnum, keyname, status);      /* construct keyword name */

    ffgkys(fptr, keyname, tdimstr, NULL, &tstatus); /* try reading keyword */

    ffdtdmll(fptr, tdimstr, colnum, maxdim,naxis, naxes, status); /* decode it */

    return(*status);
}